

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O2

int ply_read_chunk(p_ply ply,void *anybuffer,size_t size)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    if (size <= uVar4) {
      return 1;
    }
    while (ply->buffer_last <= ply->buffer_first) {
      ply->buffer_first = 0;
      if ((FILE *)ply->fp == (FILE *)0x0) {
        iVar1 = gzread(ply->gzfp,ply->buffer,0x2000);
        sVar3 = (size_t)iVar1;
      }
      else {
        sVar3 = fread(ply->buffer,1,0x2000,(FILE *)ply->fp);
      }
      ply->buffer_last = sVar3;
      uVar2 = (uint)(sVar3 != 0);
      if (sVar3 == 0) {
        return uVar2;
      }
      if (size <= uVar4) {
        return uVar2;
      }
    }
    *(char *)((long)anybuffer + uVar4) = ply->buffer[ply->buffer_first];
    ply->buffer_first = ply->buffer_first + 1;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static int ply_read_chunk(p_ply ply, void *anybuffer, size_t size) {
    char *buffer = (char *)anybuffer;
    size_t i = 0;
    assert(ply && (ply->fp || ply->gzfp) && ply->io_mode == PLY_READ);
    assert(ply->buffer_first <= ply->buffer_last);
    while (i < size) {
        if (ply->buffer_first < ply->buffer_last) {
            buffer[i] = ply->buffer[ply->buffer_first];
            ply->buffer_first++;
            i++;
        } else {
            ply->buffer_first = 0;
            if (ply->fp)
                ply->buffer_last = fread(ply->buffer, 1, BUFFERSIZE, ply->fp);
            else
                ply->buffer_last = gzread(ply->gzfp, ply->buffer, BUFFERSIZE);
            if (ply->buffer_last <= 0) return 0;
        }
    }
    return 1;
}